

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# horizontal.cpp
# Opt level: O3

void __thiscall
cppurses::layout::Horizontal::distribute_space
          (Horizontal *this,
          vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
          *widgets,int width_left)

{
  _Map_pointer ppuVar1;
  undefined8 uVar2;
  Type TVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  ulong *puVar7;
  _Map_pointer ppuVar8;
  _Map_pointer ppuVar9;
  int iVar10;
  Dimensions_reference *d;
  pointer pDVar11;
  _Elt_pointer puVar12;
  iterator __end3;
  _Elt_pointer puVar13;
  long lVar14;
  pointer pDVar15;
  pointer pDVar16;
  Dimensions_reference *d_3;
  _Map_pointer ppuVar17;
  int iVar18;
  int iVar19;
  ulong *puVar20;
  ulong uVar21;
  vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  *__range2;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double dVar27;
  vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  *__range2_1;
  deque<unsigned_long,_std::allocator<unsigned_long>_> width_additions;
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> local_f8;
  ulong *local_a8;
  ulong local_a0;
  pointer local_98;
  double dStack_90;
  pointer *local_88;
  Horizontal *local_80;
  double local_78;
  double dStack_70;
  vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  local_60;
  vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  local_48;
  
  pDVar11 = (widgets->
            super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pDVar15 = (widgets->
            super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (pDVar11 == pDVar15) {
    local_98 = (pointer)0x0;
    dStack_90 = 0.0;
  }
  else {
    lVar14 = 0;
    do {
      if (((pDVar11->widget->width_policy).type_ & ~Minimum) == Expanding) {
        lVar14 = lVar14 + (pDVar11->widget->width_policy).stretch_;
      }
      pDVar11 = pDVar11 + 1;
    } while (pDVar11 != pDVar15);
    auVar23._8_4_ = (int)((ulong)lVar14 >> 0x20);
    auVar23._0_8_ = lVar14;
    auVar23._12_4_ = 0x45300000;
    dStack_90 = auVar23._8_8_ - 1.9342813113834067e+25;
    local_98 = (pointer)(dStack_90 + ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0)
                        );
  }
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_last = (ulong *)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur = (ulong *)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_first = (ulong *)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_last = (ulong *)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_cur = (ulong *)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_first = (ulong *)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_80 = this;
  std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map(&local_f8,0);
  pDVar11 = (widgets->
            super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pDVar15 = (widgets->
            super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (pDVar11 != pDVar15) {
    local_78 = (double)width_left;
    local_88 = &local_48.
                super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    lVar14 = 0x18;
    do {
      lVar5 = *(long *)((long)&pDVar11[-1].widget + lVar14);
      if ((*(uint *)(lVar5 + 0x160) & 0xfffffffe) == 4) {
        uVar2 = *(undefined8 *)(lVar5 + 0x168);
        auVar24._0_8_ = (double)CONCAT44(0x43300000,(int)uVar2);
        auVar24._8_4_ = (int)((ulong)uVar2 >> 0x20);
        auVar24._12_4_ = 0x45300000;
        dVar27 = (((auVar24._8_8_ - 1.9342813113834067e+25) + (auVar24._0_8_ - 4503599627370496.0))
                 / (double)local_98) * local_78;
        local_a0 = (ulong)dVar27;
        local_a0 = (long)(dVar27 - 9.223372036854776e+18) & (long)local_a0 >> 0x3f | local_a0;
        if (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_f8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<unsigned_long,_std::allocator<unsigned_long>_>::_M_push_back_aux<unsigned_long>
                    ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8,&local_a0);
        }
        else {
          *local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_a0;
          local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
        puVar20 = *(ulong **)((long)pDVar11 + lVar14 + -0x10);
        uVar21 = *puVar20;
        puVar12 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_f8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          puVar12 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        uVar6 = *(ulong *)(*(long *)((long)&pDVar11[-1].widget + lVar14) + 0x180);
        if (uVar6 < puVar12[-1] + uVar21) {
          *puVar20 = uVar6;
          pDVar15 = (widgets->
                    super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pDVar16 = (widgets->
                    super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          pDVar11 = (pointer)((long)&pDVar15->widget + lVar14);
          if (pDVar11 != pDVar16) {
            memmove((void *)((long)&pDVar15[-1].widget + lVar14),pDVar11,
                    (long)pDVar16 + (-lVar14 - (long)pDVar15));
            pDVar16 = (widgets->
                      super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          }
          (widgets->
          super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
          )._M_impl.super__Vector_impl_data._M_finish = pDVar16 + -1;
          std::
          vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
          ::vector(&local_48,widgets);
          distribute_space(local_80,&local_48,((int)uVar21 - (int)uVar6) + width_left);
          local_60.
          super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
          ._M_impl.super__Vector_impl_data._M_start =
               local_48.
               super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
               ._M_impl.super__Vector_impl_data._M_start;
          goto LAB_00141e80;
        }
      }
      pDVar16 = (pointer)((long)&pDVar11->widget + lVar14);
      lVar14 = lVar14 + 0x18;
    } while (pDVar16 != pDVar15);
    pDVar15 = (widgets->
              super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    for (pDVar11 = (widgets->
                   super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                   )._M_impl.super__Vector_impl_data._M_start; pDVar11 != pDVar15;
        pDVar11 = pDVar11 + 1) {
      if (((pDVar11->widget->width_policy).type_ & ~Minimum) == Expanding) {
        *pDVar11->width = *pDVar11->width + *local_f8._M_impl.super__Deque_impl_data._M_start._M_cur
        ;
        width_left = width_left - (int)*local_f8._M_impl.super__Deque_impl_data._M_start._M_cur;
        if (local_f8._M_impl.super__Deque_impl_data._M_start._M_cur ==
            local_f8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
          operator_delete(local_f8._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
          local_f8._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_f8._M_impl.super__Deque_impl_data._M_start._M_node[1];
          local_f8._M_impl.super__Deque_impl_data._M_start._M_last =
               local_f8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
          local_f8._M_impl.super__Deque_impl_data._M_start._M_first =
               local_f8._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_f8._M_impl.super__Deque_impl_data._M_start._M_node =
               local_f8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
        }
        else {
          local_f8._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_f8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
        }
      }
    }
  }
  ppuVar9 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_node;
  ppuVar8 = local_f8._M_impl.super__Deque_impl_data._M_start._M_node;
  puVar13 = local_f8._M_impl.super__Deque_impl_data._M_start._M_last;
  puVar12 = local_f8._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (width_left != 0) {
    pDVar11 = (widgets->
              super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_98 = (widgets->
               super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    if (pDVar11 == local_98) {
      local_78 = 0.0;
      dStack_70 = 0.0;
    }
    else {
      lVar14 = 0;
      pDVar15 = pDVar11;
      do {
        TVar3 = (pDVar15->widget->width_policy).type_;
        if ((TVar3 < (Ignored|Minimum)) && ((0x4aU >> (TVar3 & 0x1f) & 1) != 0)) {
          lVar14 = lVar14 + (pDVar15->widget->width_policy).stretch_;
        }
        pDVar15 = pDVar15 + 1;
      } while (pDVar15 != local_98);
      auVar25._8_4_ = (int)((ulong)lVar14 >> 0x20);
      auVar25._0_8_ = lVar14;
      auVar25._12_4_ = 0x45300000;
      dStack_70 = auVar25._8_8_ - 1.9342813113834067e+25;
      local_78 = dStack_70 + ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0);
    }
    puVar20 = local_f8._M_impl.super__Deque_impl_data._M_start._M_first;
    if (local_f8._M_impl.super__Deque_impl_data._M_start._M_node <
        local_f8._M_impl.super__Deque_impl_data._M_finish._M_node) {
      local_a8 = local_f8._M_impl.super__Deque_impl_data._M_start._M_first;
      ppuVar17 = local_f8._M_impl.super__Deque_impl_data._M_start._M_node;
      do {
        ppuVar1 = ppuVar17 + 1;
        ppuVar17 = ppuVar17 + 1;
        operator_delete(*ppuVar1,0x200);
      } while (ppuVar17 < ppuVar9);
      pDVar11 = (widgets->
                super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                )._M_impl.super__Vector_impl_data._M_start;
      local_98 = (widgets->
                 super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      puVar20 = local_a8;
    }
    local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur = puVar12;
    local_f8._M_impl.super__Deque_impl_data._M_finish._M_last = puVar13;
    local_f8._M_impl.super__Deque_impl_data._M_finish._M_node = ppuVar8;
    local_f8._M_impl.super__Deque_impl_data._M_finish._M_first = puVar20;
    pDVar15 = local_98;
    if (pDVar11 != local_98) {
      local_88 = &local_60.
                  super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_a8 = (ulong *)(double)width_left;
      lVar14 = 0x18;
      do {
        lVar5 = *(long *)((long)&pDVar11[-1].widget + lVar14);
        uVar4 = *(uint *)(lVar5 + 0x160);
        if ((uVar4 < 7) && ((0x4aU >> (uVar4 & 0x1f) & 1) != 0)) {
          uVar2 = *(undefined8 *)(lVar5 + 0x168);
          auVar26._0_8_ = (double)CONCAT44(0x43300000,(int)uVar2);
          auVar26._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar26._12_4_ = 0x45300000;
          dVar27 = (((auVar26._8_8_ - 1.9342813113834067e+25) + (auVar26._0_8_ - 4503599627370496.0)
                    ) / local_78) * (double)local_a8;
          local_a0 = (ulong)dVar27;
          local_a0 = (long)(dVar27 - 9.223372036854776e+18) & (long)local_a0 >> 0x3f | local_a0;
          if (puVar12 == local_f8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_push_back_aux<unsigned_long>
                      ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8,&local_a0);
            puVar20 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_first;
          }
          else {
            *puVar12 = local_a0;
            local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur = puVar12 + 1;
          }
          puVar7 = *(ulong **)((long)pDVar11 + lVar14 + -0x10);
          uVar21 = *puVar7;
          puVar13 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur == puVar20) {
            puVar13 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          uVar6 = *(ulong *)(*(long *)((long)&pDVar11[-1].widget + lVar14) + 0x180);
          puVar12 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (uVar6 < puVar13[-1] + uVar21) {
            *puVar7 = uVar6;
            pDVar15 = (widgets->
                      super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pDVar16 = (widgets->
                      super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
            pDVar11 = (pointer)((long)&pDVar15->widget + lVar14);
            if (pDVar11 != pDVar16) {
              memmove((void *)((long)&pDVar15[-1].widget + lVar14),pDVar11,
                      (long)pDVar16 + (-lVar14 - (long)pDVar15));
              pDVar16 = (widgets->
                        super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
            }
            (widgets->
            super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
            )._M_impl.super__Vector_impl_data._M_finish = pDVar16 + -1;
            std::
            vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
            ::vector(&local_60,widgets);
            distribute_space(local_80,&local_60,width_left + ((int)uVar21 - (int)uVar6));
LAB_00141e80:
            if (local_60.
                super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_60.
                              super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)*local_88 -
                              (long)local_60.
                                    super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            goto LAB_00141e98;
          }
        }
        pDVar15 = (pointer)((long)&pDVar11->widget + lVar14);
        lVar14 = lVar14 + 0x18;
      } while (pDVar15 != local_98);
      pDVar11 = (widgets->
                super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pDVar15 = (widgets->
                super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    }
    for (; pDVar11 != pDVar15; pDVar11 = pDVar11 + 1) {
      TVar3 = (pDVar11->widget->width_policy).type_;
      if ((TVar3 < (Ignored|Minimum)) && ((0x4aU >> (TVar3 & 0x1f) & 1) != 0)) {
        *pDVar11->width = *pDVar11->width + *local_f8._M_impl.super__Deque_impl_data._M_start._M_cur
        ;
        width_left = width_left - (int)*local_f8._M_impl.super__Deque_impl_data._M_start._M_cur;
        if (local_f8._M_impl.super__Deque_impl_data._M_start._M_cur ==
            local_f8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
          operator_delete(local_f8._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
          local_f8._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_f8._M_impl.super__Deque_impl_data._M_start._M_node[1];
          local_f8._M_impl.super__Deque_impl_data._M_start._M_last =
               local_f8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
          local_f8._M_impl.super__Deque_impl_data._M_start._M_first =
               local_f8._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_f8._M_impl.super__Deque_impl_data._M_start._M_node =
               local_f8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
        }
        else {
          local_f8._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_f8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
        }
      }
    }
    if (width_left != 0) {
      pDVar11 = (widgets->
                super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pDVar15 = (widgets->
                super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      pDVar16 = pDVar11;
      iVar10 = width_left;
      do {
        for (; iVar19 = iVar10, pDVar16 != pDVar15; pDVar16 = pDVar16 + 1) {
          if ((((pDVar16->widget->width_policy).type_ & ~Minimum) == Expanding) && (0 < width_left))
          {
            uVar21 = *pDVar16->width + 1;
            if (uVar21 <= (pDVar16->widget->width_policy).max_) {
              *pDVar16->width = uVar21;
              width_left = width_left + -1;
            }
          }
          iVar10 = iVar19;
        }
        pDVar16 = pDVar11;
        iVar10 = width_left;
        iVar18 = iVar19;
      } while (iVar19 != width_left);
      do {
        for (; pDVar16 != pDVar15; pDVar16 = pDVar16 + 1) {
          TVar3 = (pDVar16->widget->width_policy).type_;
          if ((TVar3 == Ignored || (TVar3 & ~Maximum) == Minimum) && (0 < iVar19)) {
            uVar21 = *pDVar16->width + 1;
            if (uVar21 <= (pDVar16->widget->width_policy).max_) {
              *pDVar16->width = uVar21;
              iVar19 = iVar19 + -1;
            }
          }
        }
        bVar22 = iVar18 != iVar19;
        pDVar16 = pDVar11;
        iVar18 = iVar19;
      } while (bVar22);
    }
  }
LAB_00141e98:
  std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base(&local_f8);
  return;
}

Assistant:

void Horizontal::distribute_space(std::vector<Dimensions_reference> widgets,
                                  int width_left) {
    // Find total stretch of first group
    std::size_t total_stretch{0};
    for (const Dimensions_reference& d : widgets) {
        auto policy = d.widget->width_policy.type();
        if (policy == Size_policy::Expanding ||
            policy == Size_policy::MinimumExpanding) {
            total_stretch += d.widget->width_policy.stretch();
        }
    }

    // Calculate new widths of widgets in new group, if any go over max_width
    // then assign max value and recurse without that widget in vector.
    std::deque<std::size_t> width_additions;
    int index{0};
    auto to_distribute = width_left;
    for (const Dimensions_reference& d : widgets) {
        auto policy = d.widget->width_policy.type();
        if (policy == Size_policy::Expanding ||
            policy == Size_policy::MinimumExpanding) {
            width_additions.push_back((d.widget->width_policy.stretch() /
                                       static_cast<double>(total_stretch)) *
                                      to_distribute);
            if ((*d.width + width_additions.back()) >
                d.widget->width_policy.max_size()) {
                width_left -= d.widget->width_policy.max_size() - *d.width;
                *d.width = d.widget->width_policy.max_size();
                widgets.erase(std::begin(widgets) + index);
                return distribute_space(widgets, width_left);
            }
        }
        ++index;
    }

    // If it has gotten this far, no widgets were over space, assign values
    for (Dimensions_reference& d : widgets) {
        auto policy = d.widget->width_policy.type();
        if (policy == Size_policy::Expanding ||
            policy == Size_policy::MinimumExpanding) {
            *d.width += width_additions.front();
            width_left -= width_additions.front();
            width_additions.pop_front();
        }
    }

    // SECOND GROUP - duplicate of above dependent on Policies to work with.
    // Preferred and Minimum
    if (width_left == 0) {
        return;
    }
    // Find total stretch
    total_stretch = 0;
    for (const Dimensions_reference& d : widgets) {
        auto policy = d.widget->width_policy.type();
        if (policy == Size_policy::Preferred ||
            policy == Size_policy::Minimum || policy == Size_policy::Ignored) {
            total_stretch += d.widget->width_policy.stretch();
        }
    }

    // Calculate new widths of widgets in new group, if any go over max_width
    // then assign max value and recurse without that widget in vector.
    width_additions.clear();
    index = 0;
    to_distribute = width_left;
    for (const Dimensions_reference& d : widgets) {
        auto policy = d.widget->width_policy.type();
        if (policy == Size_policy::Preferred ||
            policy == Size_policy::Minimum || policy == Size_policy::Ignored) {
            width_additions.push_back((d.widget->width_policy.stretch() /
                                       static_cast<double>(total_stretch)) *
                                      to_distribute);
            if ((*d.width + width_additions.back()) >
                d.widget->width_policy.max_size()) {
                width_left -= d.widget->width_policy.max_size() - *d.width;
                *d.width = d.widget->width_policy.max_size();
                widgets.erase(std::begin(widgets) + index);
                return distribute_space(widgets, width_left);
            }
        }
        ++index;
    }

    // If it has gotten this far, no widgets were over space, assign values
    for (Dimensions_reference& d : widgets) {
        auto policy = d.widget->width_policy.type();
        if (policy == Size_policy::Preferred ||
            policy == Size_policy::Minimum || policy == Size_policy::Ignored) {
            *d.width += width_additions.front();
            width_left -= width_additions.front();
            width_additions.pop_front();
        }
    }

    if (width_left == 0) {
        return;
    }
    // Rounding error extra
    // First Group
    auto width_check{0};
    do {
        width_check = width_left;
        for (Dimensions_reference& d : widgets) {
            auto policy = d.widget->width_policy.type();
            if ((policy == Size_policy::Expanding ||
                 policy == Size_policy::MinimumExpanding) &&
                width_left > 0) {
                if (*d.width + 1 <= d.widget->width_policy.max_size()) {
                    *d.width += 1;
                    width_left -= 1;
                }
            }
        }
    } while (width_check != width_left);

    // Second Group
    do {
        width_check = width_left;
        for (Dimensions_reference& d : widgets) {
            auto policy = d.widget->width_policy.type();
            if ((policy == Size_policy::Preferred ||
                 policy == Size_policy::Minimum ||
                 policy == Size_policy::Ignored) &&
                width_left > 0) {
                if (*d.width + 1 <= d.widget->width_policy.max_size()) {
                    *d.width += 1;
                    width_left -= 1;
                }
            }
        }
    } while (width_check != width_left);
}